

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int clearDatabasePage(BtShared *pBt,Pgno pgno,int freePageFlag,i64 *pnChange)

{
  ulong uVar1;
  int iVar2;
  u32 uVar3;
  ulong uVar4;
  u8 *p;
  ulong uVar5;
  long *plVar6;
  int rc;
  int local_64;
  long *local_60;
  ulong local_58;
  MemPage *pPage;
  CellInfo info;
  
  if (pBt->nPage < pgno) {
    iVar2 = sqlite3CorruptError(0x12b7a);
    return iVar2;
  }
  iVar2 = getAndInitPage(pBt,pgno,&pPage,(BtCursor *)0x0,0);
  if (iVar2 != 0) {
    return iVar2;
  }
  if (((pBt->openFlags & 4) == 0) && ((pgno == 1) + 1 != (int)pPage->pDbPage->nRef)) {
    iVar2 = sqlite3CorruptError(0x12b81);
    goto LAB_0013f4b6;
  }
  local_58 = (ulong)pPage->hdrOffset;
  local_60 = pnChange;
  for (uVar5 = 0; uVar1 = local_58, uVar4 = (ulong)pPage->nCell, uVar5 < uVar4; uVar5 = uVar5 + 1) {
    p = pPage->aData +
        (CONCAT11(pPage->aCellIdx[uVar5 * 2],pPage->aCellIdx[uVar5 * 2 + 1]) & pPage->maskPage);
    if (pPage->leaf == '\0') {
      uVar3 = sqlite3Get4byte(p);
      iVar2 = clearDatabasePage(pBt,uVar3,1,local_60);
      if (iVar2 != 0) goto LAB_0013f4b6;
    }
    (*pPage->xParseCell)(pPage,p,&info);
    if ((info.nPayload != info.nLocal) && (iVar2 = clearCellOverflow(pPage,p,&info), iVar2 != 0))
    goto LAB_0013f4b6;
  }
  local_64 = 0;
  if (pPage->leaf == '\0') {
    uVar3 = sqlite3Get4byte(pPage->aData + local_58 + 8);
    plVar6 = local_60;
    iVar2 = clearDatabasePage(pBt,uVar3,1,local_60);
    local_64 = iVar2;
    if (iVar2 != 0) goto LAB_0013f4b6;
    if ((plVar6 != (i64 *)0x0) && (pPage->intKey == '\0')) {
      uVar4 = (ulong)pPage->nCell;
      goto LAB_0013f434;
    }
  }
  else {
    plVar6 = local_60;
    if (local_60 != (long *)0x0) {
LAB_0013f434:
      *plVar6 = *plVar6 + uVar4;
    }
  }
  if (freePageFlag == 0) {
    iVar2 = sqlite3PagerWrite(pPage->pDbPage);
    if (iVar2 == 0) {
      zeroPage(pPage,pPage->aData[uVar1] | 8);
      iVar2 = 0;
    }
  }
  else {
    freePage(pPage,&local_64);
    iVar2 = local_64;
  }
LAB_0013f4b6:
  releasePage(pPage);
  return iVar2;
}

Assistant:

static int clearDatabasePage(
  BtShared *pBt,           /* The BTree that contains the table */
  Pgno pgno,               /* Page number to clear */
  int freePageFlag,        /* Deallocate page if true */
  i64 *pnChange            /* Add number of Cells freed to this counter */
){
  MemPage *pPage;
  int rc;
  unsigned char *pCell;
  int i;
  int hdr;
  CellInfo info;

  assert( sqlite3_mutex_held(pBt->mutex) );
  if( pgno>btreePagecount(pBt) ){
    return SQLITE_CORRUPT_BKPT;
  }
  rc = getAndInitPage(pBt, pgno, &pPage, 0, 0);
  if( rc ) return rc;
  if( (pBt->openFlags & BTREE_SINGLE)==0
   && sqlite3PagerPageRefcount(pPage->pDbPage) != (1 + (pgno==1))
  ){
    rc = SQLITE_CORRUPT_BKPT;
    goto cleardatabasepage_out;
  }
  hdr = pPage->hdrOffset;
  for(i=0; i<pPage->nCell; i++){
    pCell = findCell(pPage, i);
    if( !pPage->leaf ){
      rc = clearDatabasePage(pBt, get4byte(pCell), 1, pnChange);
      if( rc ) goto cleardatabasepage_out;
    }
    BTREE_CLEAR_CELL(rc, pPage, pCell, info);
    if( rc ) goto cleardatabasepage_out;
  }
  if( !pPage->leaf ){
    rc = clearDatabasePage(pBt, get4byte(&pPage->aData[hdr+8]), 1, pnChange);
    if( rc ) goto cleardatabasepage_out;
    if( pPage->intKey ) pnChange = 0;
  }
  if( pnChange ){
    testcase( !pPage->intKey );
    *pnChange += pPage->nCell;
  }
  if( freePageFlag ){
    freePage(pPage, &rc);
  }else if( (rc = sqlite3PagerWrite(pPage->pDbPage))==0 ){
    zeroPage(pPage, pPage->aData[hdr] | PTF_LEAF);
  }

cleardatabasepage_out:
  releasePage(pPage);
  return rc;
}